

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O3

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  iterator __position;
  int iVar1;
  int *piVar2;
  Expression EVar3;
  
  RNNStateMachine::transition((RNNStateMachine *)(this + 0x10),add_input);
  __position._M_current = *(int **)(this + 0x20);
  if (__position._M_current == *(int **)(this + 0x28)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)(this + 0x18),__position,(int *)(this + 8));
    iVar1 = *(int *)(this + 8);
    piVar2 = *(int **)(this + 0x20);
  }
  else {
    iVar1 = *(int *)(this + 8);
    *__position._M_current = iVar1;
    piVar2 = __position._M_current + 1;
    *(int **)(this + 0x20) = piVar2;
  }
  *(int *)(this + 8) = (int)((ulong)((long)piVar2 - *(long *)(this + 0x18)) >> 2) + -1;
  EVar3 = (Expression)
          (**(code **)(*(long *)this + 0x60))(this,iVar1,x,*(code **)(*(long *)this + 0x60));
  return EVar3;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }